

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::PlotStairs<signed_char>
               (char *label_id,char *values,int count,double xscale,double x0,int offset,int stride)

{
  undefined1 local_60 [8];
  GetterYs<signed_char> getter;
  int stride_local;
  int offset_local;
  double x0_local;
  double xscale_local;
  int count_local;
  char *values_local;
  char *label_id_local;
  
  getter.Offset = stride;
  getter.Stride = offset;
  GetterYs<signed_char>::GetterYs
            ((GetterYs<signed_char> *)local_60,values,count,xscale,x0,offset,stride);
  PlotStairsEx<ImPlot::GetterYs<signed_char>>(label_id,(GetterYs<signed_char> *)local_60);
  return;
}

Assistant:

void PlotStairs(const char* label_id, const T* values, int count, double xscale, double x0, int offset, int stride) {
    GetterYs<T> getter(values,count,xscale,x0,offset,stride);
    PlotStairsEx(label_id, getter);
}